

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

char * kj::_::
       fill<kj::ArrayPtr<kj::String_const>,kj::StringPtr&,kj::_::Delimited<kj::ArrayPtr<kj::StringPtr_const>>>
                 (char *target,Delimited<kj::ArrayPtr<const_kj::String>_> *first,StringPtr *rest,
                 Delimited<kj::ArrayPtr<const_kj::StringPtr>_> *rest_1)

{
  char *pcVar1;
  StringPtr *first_00;
  Delimited<kj::ArrayPtr<const_kj::StringPtr>_> *rest_00;
  Delimited<kj::ArrayPtr<const_kj::StringPtr>_> *rest_local_1;
  StringPtr *rest_local;
  Delimited<kj::ArrayPtr<const_kj::String>_> *first_local;
  char *target_local;
  
  pcVar1 = Delimited<kj::ArrayPtr<const_kj::String>_>::flattenTo(first,target);
  first_00 = fwd<kj::StringPtr&>(rest);
  rest_00 = fwd<kj::_::Delimited<kj::ArrayPtr<kj::StringPtr_const>>>(rest_1);
  pcVar1 = fill<kj::StringPtr,kj::_::Delimited<kj::ArrayPtr<kj::StringPtr_const>>>
                     (pcVar1,first_00,rest_00);
  return pcVar1;
}

Assistant:

char* fill(char* __restrict__ target, Delimited<T>&& first, Rest&&... rest) {
  target = first.flattenTo(target);
  return fill(target, kj::fwd<Rest>(rest)...);
}